

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int pushBoundaryTest(char *filename,char *result,char *err,int options)

{
  long lVar1;
  byte *pbVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  code *pcVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  code *pcVar10;
  undefined8 *puVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  undefined8 *puVar15;
  bool bVar16;
  int size;
  char *base;
  uint local_164;
  char *local_160;
  long local_158;
  undefined8 local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  code *local_130 [14];
  undefined8 local_c0;
  undefined8 local_b8;
  code *local_b0;
  code *local_a8;
  code *local_98;
  code *local_90;
  code *local_68;
  undefined8 local_48;
  undefined8 local_40 [2];
  
  iVar5 = strcmp(filename,"./test/HTML/xml-declaration-1.html");
  if (iVar5 == 0) {
    return 0;
  }
  nb_tests = nb_tests + 1;
  memset(local_130,0,0x100);
  if (((uint)options >> 0x1e & 1) == 0) {
    puVar11 = local_40;
    puVar15 = &local_48;
    xmlSAXVersion(local_130,2);
    pcVar6 = endElementNsBnd;
    pcVar10 = startElementNsBnd;
  }
  else {
    puVar11 = &local_b8;
    puVar15 = &local_c0;
    xmlSAX2InitHtmlDefaultSAXHandler(local_130);
    pcVar6 = endElementBnd;
    pcVar10 = startElementBnd;
  }
  *puVar15 = pcVar10;
  *puVar11 = pcVar6;
  local_130[0] = internalSubsetBnd;
  local_b0 = referenceBnd;
  local_a8 = charactersBnd;
  local_68 = cdataBlockBnd;
  local_98 = processingInstructionBnd;
  local_90 = commentBnd;
  iVar5 = loadMem(filename,&local_160,(int *)&local_164);
  if (iVar5 == 0) {
    local_138 = result;
    if (((uint)options >> 0x1e & 1) == 0) {
      lVar7 = xmlCreatePushParserCtxt(local_130,0,local_160,1,filename);
    }
    else {
      lVar7 = htmlCreatePushParserCtxt(local_130,0,local_160,1,filename,0);
    }
    local_148 = filename;
    local_140 = err;
    xmlCtxtSetErrorHandler(lVar7,testStructuredErrorHandler,0);
    xmlCtxtUseOptions(lVar7,options);
    uVar9 = (ulong)local_164;
    if ((int)local_164 < 2) {
      bVar16 = true;
      uVar12 = 0;
      pcVar13 = (char *)0x0;
      uVar14 = 0;
    }
    else {
      local_150 = 0x20;
      local_158 = 1;
      if ((options & 0x40000000U) == 0) {
        local_150 = 1;
      }
      do {
        lVar1 = local_158 + 1;
        bVar16 = true;
        if (*(int *)(lVar7 + 0x110) == 7) {
          pbVar2 = *(byte **)(*(long *)(lVar7 + 0x38) + 0x20);
          if (pbVar2 < *(byte **)(*(long *)(lVar7 + 0x38) + 0x28)) {
            uVar14 = (uint)*pbVar2;
          }
          else {
            uVar14 = (uint)local_160[local_158];
          }
          if (((uint)options >> 0x1e & 1) == 0) {
            bVar16 = uVar14 != 0x26 && uVar14 != 0x3c;
          }
          else {
            bVar16 = uVar14 != 0x3c || *(int *)(lVar7 + 0x2f0) != 0;
          }
          bVar16 = (bool)(bVar16 ^ 1);
        }
        lVar3 = *(long *)(lVar7 + 0x38);
        err = (char *)((*(long *)(lVar3 + 0x20) - *(long *)(lVar3 + 0x18)) + *(long *)(lVar3 + 0x40)
                      );
        pushBoundaryCount = 0;
        pushBoundaryRefCount = 0;
        pushBoundaryCharsCount = 0;
        pushBoundaryCDataCount = 0;
        pcVar13 = local_160 + local_158;
        local_158 = lVar1;
        if (((uint)options >> 0x1e & 1) == 0) {
          xmlParseChunk(lVar7,pcVar13,1,(int)uVar9 <= lVar1);
        }
        else {
          htmlParseChunk();
        }
        uVar14 = 1;
        if (pushBoundaryRefCount < 1) {
          uVar14 = pushBoundaryCount;
          if (1 < pushBoundaryCharsCount) {
            if (((uint)options >> 0x1e & 1) == 0) {
              uVar14 = pushBoundaryCount - 1;
            }
            else {
              uVar14 = (pushBoundaryCount - pushBoundaryCharsCount) + 1;
            }
          }
          if ((1 < pushBoundaryCDataCount & (byte)((uint)options >> 0x1e)) == 1) {
            uVar14 = (uVar14 - pushBoundaryCDataCount) + 1;
          }
        }
        lVar1 = *(long *)(lVar7 + 0x38);
        pcVar4 = *(char **)(lVar1 + 0x20);
        pcVar13 = pcVar4 + (*(long *)(lVar1 + 0x40) - *(long *)(lVar1 + 0x18));
        iVar5 = *(int *)(lVar7 + 0x110);
        if ((iVar5 == 3) || (pcVar13 < (char *)0x4)) {
          uVar12 = 0;
        }
        else {
          uVar12 = 0;
          if (pcVar13 != err) {
            lVar1 = *(long *)(lVar1 + 0x28);
            if ((((uint)options >> 0x1e & 1) == 0) || (uVar9 = 3, iVar5 != 9)) {
              if (bVar16) {
                uVar9 = (ulong)(iVar5 == 8) * 5;
              }
              else if ((((uint)options >> 0x1e & 1) == 0) || (*(int *)(lVar7 + 0x2f0) == 0)) {
                if (*pcVar4 == '<') {
                  uVar9 = 1;
                }
                else {
                  uVar9 = local_150;
                  if (*pcVar4 != '&') {
                    uVar9 = 3;
                  }
                }
              }
              else {
                sVar8 = strlen(*(char **)(lVar7 + 0x120));
                uVar9 = sVar8 + 2;
              }
            }
            uVar12 = lVar1 - (long)pcVar4;
            if (uVar12 <= uVar9) {
              uVar12 = 0;
            }
          }
        }
        uVar9 = (ulong)(int)local_164;
        bVar16 = uVar12 == 0;
      } while (((local_158 < (long)uVar9) && ((int)uVar14 < 2)) && (uVar12 == 0));
    }
    if (((uint)options >> 0x1e & 1) == 0) {
      local_150 = CONCAT44(local_150._4_4_,
                           (int)CONCAT71((int7)(uVar9 >> 8),*(int *)(lVar7 + 0x18) == 0));
    }
    else {
      local_150 = (ulong)local_150._4_4_ << 0x20;
    }
    local_158 = *(undefined8 *)(lVar7 + 0x10);
    xmlFreeParserCtxt(lVar7);
    free(local_160);
    filename = local_148;
    lVar7 = local_158;
    if (1 < (int)uVar14) {
      xmlFreeDoc(local_158);
      fprintf(_stderr,"Failed push boundary callback test (%d@%lu-%lu): %s\n",(ulong)uVar14,err,
              pcVar13,local_148);
      return -1;
    }
    if (!bVar16) {
      xmlFreeDoc(local_158);
      fprintf(_stderr,"Failed push boundary buffer test (%lu@%lu): %s\n",uVar12,pcVar13,local_148);
      return -1;
    }
    if ((char)local_150 == '\0') {
      if (((uint)options >> 0x1e & 1) == 0) {
        xmlDocDumpMemory(local_158,&local_160,&local_164);
      }
      else {
        htmlDocDumpMemory();
      }
      pcVar4 = local_138;
      pcVar13 = local_140;
      xmlFreeDoc(lVar7);
      iVar5 = compareFileMem(pcVar4,local_160,local_164);
      if ((local_160 == (char *)0x0) || (iVar5 != 0)) {
        if (local_160 != (char *)0x0) {
          (*_xmlFree)();
        }
        fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar4);
        return -1;
      }
      (*_xmlFree)();
      if (pcVar13 == (char *)0x0) {
        return 0;
      }
      iVar5 = compareFileMem(pcVar13,testErrors,testErrorsSize);
      if (iVar5 == 0) {
        return 0;
      }
      pcVar13 = "Error for %s failed\n";
    }
    else {
      xmlFreeDoc(local_158);
      pcVar13 = "Failed to parse %s\n";
      filename = local_148;
    }
  }
  else {
    pcVar13 = "Failed to load %s\n";
  }
  fprintf(_stderr,pcVar13,filename);
  return -1;
}

Assistant:

static int
pushBoundaryTest(const char *filename, const char *result,
                 const char *err ATTRIBUTE_UNUSED,
                 int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    xmlSAXHandler bndSAX;
    const char *base;
    int size, res, numCallbacks;
    int cur = 0;
    unsigned long avail, oldConsumed, consumed;

    /*
     * HTML encoding detection doesn't work when data is fed bytewise.
     */
    if (strcmp(filename, "./test/HTML/xml-declaration-1.html") == 0)
        return(0);

    /*
     * If the parser made progress, check that exactly one construct was
     * processed and that the input buffer is (almost) empty.
     * Since we use a chunk size of 1, this tests whether content is
     * processed as early as possible.
     */

    nb_tests++;

    memset(&bndSAX, 0, sizeof(bndSAX));
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        xmlSAX2InitHtmlDefaultSAXHandler(&bndSAX);
        bndSAX.startElement = startElementBnd;
        bndSAX.endElement = endElementBnd;
    } else
#endif
    {
        xmlSAXVersion(&bndSAX, 2);
        bndSAX.startElementNs = startElementNsBnd;
        bndSAX.endElementNs = endElementNsBnd;
    }

    bndSAX.internalSubset = internalSubsetBnd;
    bndSAX.reference = referenceBnd;
    bndSAX.characters = charactersBnd;
    bndSAX.cdataBlock = cdataBlockBnd;
    bndSAX.processingInstruction = processingInstructionBnd;
    bndSAX.comment = commentBnd;

    /*
     * load the document in memory and work from there.
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	ctxt = htmlCreatePushParserCtxt(&bndSAX, NULL, base, 1, filename,
	                                XML_CHAR_ENCODING_NONE);
    else
#endif
    ctxt = xmlCreatePushParserCtxt(&bndSAX, NULL, base, 1, filename);
    xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
    xmlCtxtUseOptions(ctxt, options);
    cur = 1;
    consumed = 0;
    numCallbacks = 0;
    avail = 0;
    while ((cur < size) && (numCallbacks <= 1) && (avail <= 0)) {
        int terminate = (cur + 1 >= size);
        int isText = 0;

        if (ctxt->instate == XML_PARSER_CONTENT) {
            int firstChar = (ctxt->input->end > ctxt->input->cur) ?
                            *ctxt->input->cur :
                            base[cur];

            if (options & XML_PARSE_HTML) {
                isText = ((ctxt->endCheckState) || (firstChar != '<'));
            } else {
                isText = ((firstChar != '<') && (firstChar != '&'));
            }
        }

        oldConsumed = ctxt->input->consumed +
                      (unsigned long) (ctxt->input->cur - ctxt->input->base);

        pushBoundaryCount = 0;
        pushBoundaryRefCount = 0;
        pushBoundaryCharsCount = 0;
        pushBoundaryCDataCount = 0;

#ifdef LIBXML_HTML_ENABLED
        if (options & XML_PARSE_HTML)
            htmlParseChunk(ctxt, base + cur, 1, terminate);
        else
#endif
        xmlParseChunk(ctxt, base + cur, 1, terminate);
	cur += 1;

        /*
         * Callback check: Check that only a single construct was parsed.
         */
        if (pushBoundaryRefCount > 0) {
            numCallbacks = 1;
        } else {
            numCallbacks = pushBoundaryCount;
            if (pushBoundaryCharsCount > 1) {
                if (options & XML_PARSE_HTML) {
                    /*
                     * The HTML parser can generate a mix of chars and
                     * references.
                     */
                    numCallbacks -= pushBoundaryCharsCount - 1;
                } else {
                    /*
                     * Allow two chars callbacks. This can happen when
                     * multi-byte chars are split across buffer boundaries.
                     */
                    numCallbacks -= 1;
                }
            }
            if (options & XML_PARSE_HTML) {
                /*
                 * Allow multiple cdata callbacks in HTML mode.
                 */
                if (pushBoundaryCDataCount > 1)
                    numCallbacks -= pushBoundaryCDataCount - 1;
            }
        }

        /*
         * Buffer check: If input was consumed, check that the input
         * buffer is (almost) empty.
         */
        consumed = ctxt->input->consumed +
                   (unsigned long) (ctxt->input->cur - ctxt->input->base);
        if ((ctxt->instate != XML_PARSER_DTD) &&
            (consumed >= 4) &&
            (consumed != oldConsumed)) {
            size_t max = 0;

            avail = ctxt->input->end - ctxt->input->cur;

            if ((options & XML_PARSE_HTML) &&
                (ctxt->instate == XML_PARSER_END_TAG)) {
                /* Something related to script parsing. */
                max = 3;
            } else if (isText) {
                int c = *ctxt->input->cur;

                if ((options & XML_PARSE_HTML) &&
                    (ctxt->endCheckState)) {
                    max = strlen((const char *) ctxt->name) + 2;
                } else if (c == '&') {
                    max = (options & XML_PARSE_HTML) ? 32 : 1;
                } else if (c == '<') {
                    max = 1;
                } else {
                    /* 3 bytes for partial UTF-8 */
                    max = 3;
                }
            } else if (ctxt->instate == XML_PARSER_CDATA_SECTION) {
                /* 2 bytes for terminator, 3 bytes for UTF-8 */
                max = 5;
            }

            if (avail <= max)
                avail = 0;
        }
    }
    doc = ctxt->myDoc;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
        res = 1;
    else
#endif
    res = ctxt->wellFormed;
    xmlFreeParserCtxt(ctxt);
    free((char *)base);
    if (numCallbacks > 1) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed push boundary callback test (%d@%lu-%lu): %s\n",
                numCallbacks, oldConsumed, consumed, filename);
	return(-1);
    }
    if (avail > 0) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed push boundary buffer test (%lu@%lu): %s\n",
                avail, consumed, filename);
	return(-1);
    }
    if (!res) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    else
#endif
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    xmlFreeDoc(doc);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
	if (base != NULL)
	    xmlFree((char *)base);
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	return(-1);
    }
    xmlFree((char *)base);
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    }
    return(0);
}